

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

bool __thiscall
Shell::Options::OptionValue<Shell::Options::Intent>::checkConstraints
          (OptionValue<Shell::Options::Intent> *this)

{
  bool bVar1;
  int iVar2;
  Mode MVar3;
  BadOption BVar4;
  pointer pOVar5;
  ostream *poVar6;
  UserErrorException *pUVar7;
  RefIterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  RefIterator local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Lib::
  Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>_>
  ::RefIterator::RefIterator(&local_c0,&this->_constraints);
  bVar1 = Lib::
          Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>_>
          ::RefIterator::hasNext(&local_c0);
  if (bVar1) {
    do {
      Lib::
      Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>_>
      ::RefIterator::next(&local_c0);
      pOVar5 = std::
               unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
               ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                             *)0x7611af);
      iVar2 = (*pOVar5->_vptr_OptionValueConstraint[2])(pOVar5,this);
      if ((char)iVar2 == '\0') {
        MVar3 = mode(Lib::env);
        if (MVar3 == SPIDER) {
          reportSpiderFail();
          pUVar7 = (UserErrorException *)__cxa_allocate_exception(0x50);
          pOVar5 = std::
                   unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                   ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                                 *)0x761328);
          (*pOVar5->_vptr_OptionValueConstraint[3])(&local_100,pOVar5,this);
          std::operator+(&local_50,"\nBroken Constraint: ",&local_100);
          Lib::UserErrorException::Exception(pUVar7,&local_50);
          __cxa_throw(pUVar7,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        pOVar5 = std::
                 unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                 ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                               *)0x7611dd);
        bVar1 = OptionValueConstraint<Shell::Options::Intent>::isHard(pOVar5);
        if (bVar1) {
          pUVar7 = (UserErrorException *)__cxa_allocate_exception(0x50);
          pOVar5 = std::
                   unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                   ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                                 *)0x761397);
          (*pOVar5->_vptr_OptionValueConstraint[3])(&local_100,pOVar5,this);
          std::operator+(&local_70,"\nBroken Constraint: ",&local_100);
          Lib::UserErrorException::Exception(pUVar7,&local_70);
          __cxa_throw(pUVar7,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        BVar4 = getBadOptionChoice(Lib::env);
        if (BVar4 != FORCED) {
          if (BVar4 != OFF) {
            if (BVar4 != SOFT) {
              pUVar7 = (UserErrorException *)__cxa_allocate_exception(0x50);
              pOVar5 = std::
                       unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                       ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                                     *)0x76146c);
              (*pOVar5->_vptr_OptionValueConstraint[3])(&local_100,pOVar5,this);
              std::operator+(&local_90,"\nBroken Constraint: ",&local_100);
              Lib::UserErrorException::Exception(pUVar7,&local_90);
              __cxa_throw(pUVar7,&Lib::UserErrorException::typeinfo,
                          Lib::UserErrorException::~UserErrorException);
            }
            pOVar5 = std::
                     unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                     ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                                   *)0x76129c);
            (*pOVar5->_vptr_OptionValueConstraint[3])(&local_e0,pOVar5,this);
            std::operator+(&local_100,"WARNING Broken Constraint: ",&local_e0);
            poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_100);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_e0);
          }
          return false;
        }
        pOVar5 = std::
                 unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                 ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                               *)0x761207);
        iVar2 = (*pOVar5->_vptr_OptionValueConstraint[4])(pOVar5,this);
        if ((char)iVar2 == '\0') {
          pUVar7 = (UserErrorException *)__cxa_allocate_exception(0x50);
          pOVar5 = std::
                   unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                   ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                                 *)0x761406);
          (*pOVar5->_vptr_OptionValueConstraint[3])(&local_100,pOVar5,this);
          std::operator+(&local_b0,"\nCould not force Constraint: ",&local_100);
          Lib::UserErrorException::Exception(pUVar7,&local_b0);
          __cxa_throw(pUVar7,&Lib::UserErrorException::typeinfo,
                      Lib::UserErrorException::~UserErrorException);
        }
        pOVar5 = std::
                 unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                 ::operator->((unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>
                               *)0x761223);
        (*pOVar5->_vptr_OptionValueConstraint[3])(&local_e0,pOVar5,this);
        std::operator+(&local_100,"Forced constraint ",&local_e0);
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)&local_100);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_e0);
      }
      bVar1 = Lib::
              Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::Intent>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::Intent>_>_>_>
              ::RefIterator::hasNext(&local_c0);
    } while (bVar1);
  }
  return true;
}

Assistant:

bool Options::OptionValue<T>::checkConstraints()
{
  typename Lib::Stack<OptionValueConstraintUP<T>>::RefIterator it(_constraints);
  while (it.hasNext()) {
    const OptionValueConstraintUP<T> &con = it.next();
    if (!con->check(*this)) {

      if (env.options->mode() == Mode::SPIDER) {
      reportSpiderFail();
      USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      }

      if (con->isHard()) {
        USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      }
      switch (env.options->getBadOptionChoice()) {
      case BadOption::HARD:
        USER_ERROR("\nBroken Constraint: " + con->msg(*this));
      case BadOption::SOFT:
        cout << "WARNING Broken Constraint: " + con->msg(*this) << endl;
        return false;
      case BadOption::FORCED:
        if (con->force(this)) {
          cout << "Forced constraint " + con->msg(*this) << endl;
          break;
        }
        else {
          USER_ERROR("\nCould not force Constraint: " + con->msg(*this));
        }
      case BadOption::OFF:
        return false;
      default:
        ASSERTION_VIOLATION;
      }
    }
  }
  return true;
}